

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_GLSL_uniform(Context *ctx,RegisterType regtype,int regnum,VariableList *var)

{
  char *pcVar1;
  char *len;
  uint uVar2;
  size_t in_R8;
  char name [64];
  char varname [64];
  char acStack_a8 [64];
  char local_68 [64];
  
  pcVar1 = get_D3D_register_string(ctx,regtype,regnum,acStack_a8,in_R8);
  len = ctx->shader_type_str;
  snprintf(local_68,0x40,"%s_%s%s",len,pcVar1,acStack_a8);
  push_output(ctx,&ctx->globals);
  if (var == (VariableList *)0x0) {
    get_GLSL_uniform_array_varname(ctx,regtype,acStack_a8,(size_t)len);
    if (regtype == REG_TYPE_CONSTBOOL) {
      uVar2 = ctx->uniform_bool_count;
    }
    else if (regtype == REG_TYPE_CONSTINT) {
      uVar2 = ctx->uniform_int4_count;
    }
    else if (regtype == REG_TYPE_CONST) {
      uVar2 = ctx->uniform_float4_count;
    }
    else {
      uVar2 = 0;
      if (ctx->isfail == 0) {
        __assert_fail("isfail(ctx)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x9ab,
                      "void emit_GLSL_uniform(Context *, RegisterType, int, const VariableList *)");
      }
    }
  }
  else {
    uVar2 = var->index;
    if (var->constant == (ConstantsList *)0x0) {
      if (var->emit_position == -1) {
        __assert_fail("var->emit_position != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x9bb,
                      "void emit_GLSL_uniform(Context *, RegisterType, int, const VariableList *)");
      }
      get_GLSL_uniform_array_varname(ctx,regtype,acStack_a8,(size_t)len);
      uVar2 = (regnum - uVar2) + var->emit_position;
    }
    else {
      snprintf(acStack_a8,0x40,"%s_const_array_%d_%d",ctx->shader_type_str,(ulong)uVar2,
               (ulong)(uint)var->count);
      uVar2 = regnum - uVar2;
    }
  }
  output_line(ctx,"#define %s %s[%d]",local_68,acStack_a8,(ulong)uVar2);
  if (0 < ctx->output_stack_len) {
    uVar2 = ctx->output_stack_len - 1;
    ctx->output_stack_len = uVar2;
    ctx->output = ctx->output_stack[uVar2];
    ctx->indent = ctx->indent_stack[uVar2];
    return;
  }
  __assert_fail("ctx->output_stack_len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x173,"void pop_output(Context *)");
}

Assistant:

static void emit_GLSL_uniform(Context *ctx, RegisterType regtype, int regnum,
                              const VariableList *var)
{
    // Now that we're pushing all the uniforms as one big array, pack these
    //  down, so if we only use register c439, it'll actually map to
    //  glsl_uniforms_vec4[0]. As we push one big array, this will prevent
    //  uploading unused data.

    char varname[64];
    char name[64];
    int index = 0;

    get_GLSL_varname_in_buf(ctx, regtype, regnum, varname, sizeof (varname));

    push_output(ctx, &ctx->globals);

    if (var == NULL)
    {
        get_GLSL_uniform_array_varname(ctx, regtype, name, sizeof (name));

        if (regtype == REG_TYPE_CONST)
            index = ctx->uniform_float4_count;
        else if (regtype == REG_TYPE_CONSTINT)
            index = ctx->uniform_int4_count;
        else if (regtype == REG_TYPE_CONSTBOOL)
            index = ctx->uniform_bool_count;
        else  // get_GLSL_uniform_array_varname() would have called fail().
            assert(isfail(ctx));

        output_line(ctx, "#define %s %s[%d]", varname, name, index);
    } // if

    else
    {
        const int arraybase = var->index;
        if (var->constant)
        {
            get_GLSL_const_array_varname_in_buf(ctx, arraybase, var->count,
                                                name, sizeof (name));
            index = (regnum - arraybase);
        } // if
        else
        {
            assert(var->emit_position != -1);
            get_GLSL_uniform_array_varname(ctx, regtype, name, sizeof (name));
            index = (regnum - arraybase) + var->emit_position;
        } // else

        output_line(ctx, "#define %s %s[%d]", varname, name, index);
    } // else

    pop_output(ctx);
}